

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O0

void __thiscall
Reflection::StructImpl<Sinclair::ZXSpectrum::State>::set
          (StructImpl<Sinclair::ZXSpectrum::State> *this,string *name,void *value,size_t offset)

{
  long lVar1;
  size_t sVar2;
  iterator iVar3;
  bool bVar4;
  pointer ppVar5;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_true>
  local_30;
  iterator iterator;
  size_t offset_local;
  void *value_local;
  string *name_local;
  StructImpl<Sinclair::ZXSpectrum::State> *this_local;
  
  iterator.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_true>
             )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_true>
               )offset;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>_>_>
       ::find(&contents__abi_cxx11_,name);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>_>_>
       ::end(&contents__abi_cxx11_);
  bVar4 = std::__detail::operator==(&local_30,&local_38);
  iVar3 = iterator;
  if (!bVar4) {
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_false,_true>
                           *)&local_30);
    if ((__node_type *)(ppVar5->second).count <=
        (ulong)iVar3.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_true>
               ._M_cur) {
      __assert_fail("offset < iterator->second.count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/State/../../Analyser/Static/../../Reflection/Struct.hpp"
                    ,0xab,
                    "virtual void Reflection::StructImpl<Sinclair::ZXSpectrum::State>::set(const std::string &, const void *, size_t) [Owner = Sinclair::ZXSpectrum::State]"
                   );
    }
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_false,_true>
                           *)&local_30);
    iVar3 = iterator;
    lVar1 = (ppVar5->second).offset;
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_false,_true>
                           *)&local_30);
    sVar2 = (ppVar5->second).size;
    ppVar5 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_false,_true>
                           *)&local_30);
    memcpy((void *)((long)&(this->super_Struct)._vptr_Struct +
                   (long)iVar3.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Reflection::StructImpl<Sinclair::ZXSpectrum::State>::Field>,_true>
                         ._M_cur * sVar2 + lVar1),value,(ppVar5->second).size);
  }
  return;
}

Assistant:

void set(const std::string &name, const void *value, size_t offset) final {
			const auto iterator = contents_.find(name);
			if(iterator == contents_.end()) return;
			assert(offset < iterator->second.count);
			memcpy(reinterpret_cast<uint8_t *>(this) + iterator->second.offset + offset * iterator->second.size, value, iterator->second.size);
		}